

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void openpipe(int output_id,string *pipe,FILE **fout)

{
  bool bVar1;
  FILE *pFVar2;
  
  bVar1 = std::operator==(pipe,"-");
  pFVar2 = _stdout;
  if ((!bVar1) && (pFVar2 = fopen((pipe->_M_dataplus)._M_p,"wb"), pFVar2 == (FILE *)0x0)) {
    fprintf(_stderr,"FATAL: Cannot open %s for output\n",(pipe->_M_dataplus)._M_p);
    exit(1);
  }
  fout[output_id] = (FILE *)pFVar2;
  return;
}

Assistant:

void openpipe(int output_id, const std::string& pipe, FILE** fout)
{
	if (pipe == "-") {
		fout[output_id] = stdout;
	} else {
		FILE * f = fopen(pipe.c_str(), "wb");
		if (f != nullptr) {
			fout[output_id] = f;
		} else {
			fprintf(stderr, "FATAL: Cannot open %s for output\n",
				pipe.c_str());
			exit(EXIT_FAILURE);
		}
	}
}